

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

int remove_from_value_if_invalid_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  bool bVar3;
  Am_Object o;
  Am_Object obj;
  Am_Value v;
  Am_Value_List values;
  Am_Object local_40;
  Am_Object local_38;
  
  Am_Object::Make_Unique(self,0x169);
  Am_Value_List::Am_Value_List(&values);
  pAVar2 = Am_Object::Get(self,0x169,0);
  Am_Value_List::operator=(&values,pAVar2);
  obj.data = (Am_Object_Data *)0x0;
  o.data = (Am_Object_Data *)0x0;
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Start(&values);
  bVar3 = false;
  while( true ) {
    bVar1 = Am_Value_List::Last(&values);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&values);
    Am_Object::operator=(&obj,pAVar2);
    Am_Object::Am_Object(&local_38,&obj);
    bVar1 = Am_Object_And_Owners_Valid_And_Visible(&local_38);
    Am_Object::~Am_Object(&local_38);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&obj,100,1);
      Am_Value::operator=(&v,pAVar2);
      pAVar2 = Am_Object::Get(&obj,0x69,1);
      Am_Value::operator=(&v,pAVar2);
      Am_Object::Get_Owner(&local_40,(Am_Slot_Flags)&obj);
      Am_Object::operator=(&o,&local_40);
      Am_Object::~Am_Object(&local_40);
    }
    else {
      bVar3 = true;
      Am_Value_List::Delete(&values,false);
    }
    Am_Value_List::Next(&values);
  }
  if (bVar3) {
    Am_Object::Note_Changed(self,0x169);
  }
  Am_Value::~Am_Value(&v);
  Am_Object::~Am_Object(&o);
  Am_Object::~Am_Object(&obj);
  Am_Value_List::~Am_Value_List(&values);
  return 0;
}

Assistant:

Am_Define_Formula(int, remove_from_value_if_invalid)
{
  self.Make_Unique(Am_VALUE);
  Am_Value_List values;
  values = self.Get(Am_VALUE);
  Am_Object obj, o;
  Am_Value v;
  bool changed = false;
  for (values.Start(); !values.Last(); values.Next()) {
    obj = values.Get();
    if (!Am_Object_And_Owners_Valid_And_Visible(obj)) {
      values.Delete(false);
      changed = true;
    } else {
      //set up dependencies so this formula will be re-evaluated if
      //the object is modified
      v = obj.Peek(Am_LEFT);
      v = obj.Peek(Am_VISIBLE);
      o = obj.Get_Owner();
    }
  }
  if (changed) {
    self.Note_Changed(Am_VALUE);
  }
  return 0;
}